

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rowSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  int iVar1;
  int iVar2;
  int p_col;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  pointer pnVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  pointer pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  undefined4 *puVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar22 = 0;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems[0xe] = 0;
  local_1b8.data._M_elems[0xf] = 0;
  local_1b8.data._M_elems[0x10] = 0;
  local_1b8.data._M_elems[0x11] = 0;
  local_1b8.data._M_elems[0x12] = 0;
  local_1b8.data._M_elems[0x13] = 0;
  local_1b8.data._M_elems[0x14] = 0;
  local_1b8.data._M_elems[0x15] = 0;
  local_1b8.data._M_elems[0x16] = 0;
  local_1b8.data._M_elems[0x17] = 0;
  local_1b8.data._M_elems[0x18] = 0;
  local_1b8.data._M_elems[0x19] = 0;
  local_1b8.data._M_elems._104_5_ = 0;
  local_1b8.data._M_elems[0x1b]._1_3_ = 0;
  piVar5 = (this->temp).s_mark;
  iVar1 = (this->temp).stage;
  lVar20 = (long)iVar1;
  if (0 < this->thedim) {
    piVar6 = (this->row).perm;
    piVar7 = (this->u).row.len;
    lVar14 = 0;
    do {
      if ((piVar6[lVar14] < 0) && (piVar7[lVar14] == 1)) {
        iVar2 = (this->temp).stage;
        (this->temp).stage = iVar2 + 1;
        piVar5[iVar2] = (int)lVar14;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->thedim);
  }
  if (iVar1 < (this->temp).stage) {
    do {
      iVar1 = piVar5[lVar20];
      iVar2 = (this->u).row.start[iVar1];
      pnVar8 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_col = (this->u).row.idx[iVar2];
      pnVar17 = pnVar8 + iVar2;
      pcVar16 = &local_1b8;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_1b8.exp = pnVar8[iVar2].m_backend.exp;
      local_1b8.neg = pnVar8[iVar2].m_backend.neg;
      local_1b8.fpclass = pnVar8[iVar2].m_backend.fpclass;
      local_1b8.prec_elem = pnVar8[iVar2].m_backend.prec_elem;
      pcVar16 = &local_1b8;
      pnVar18 = &local_b0;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_b0.m_backend.exp = local_1b8.exp;
      local_b0.m_backend.neg = local_1b8.neg;
      local_b0.m_backend.fpclass = local_1b8.fpclass;
      local_b0.m_backend.prec_elem = local_1b8.prec_elem;
      setPivot(this,(int)lVar20,p_col,iVar1,&local_b0);
      (this->u).row.len[iVar1] = 0;
      iVar2 = (this->u).col.start[p_col];
      piVar6 = (this->u).col.idx;
      iVar3 = (this->temp).s_cact[p_col];
      iVar10 = makeLvec(this,iVar3 + -1,iVar1);
      piVar7 = (this->u).col.len;
      iVar4 = piVar7[p_col];
      iVar11 = iVar4 - iVar3;
      piVar7[p_col] = iVar11;
      if (0 < iVar3) {
        lVar14 = (long)iVar11;
        do {
          iVar3 = piVar6[iVar2 + lVar14];
          if (iVar3 != iVar1) {
            piVar7 = (this->u).row.len;
            iVar11 = piVar7[iVar3];
            piVar7[iVar3] = iVar11 + -1;
            lVar12 = (long)(iVar11 + -1 + (this->u).row.start[iVar3]);
            lVar13 = lVar12 * 4;
            lVar9 = lVar12 * 0x80 + 0x80;
            do {
              lVar21 = lVar9;
              lVar15 = lVar13;
              lVar13 = lVar15 + -4;
              lVar9 = lVar21 + -0x80;
            } while (*(int *)((long)(this->u).row.idx + lVar15) != p_col);
            (this->l).idx[iVar10] = iVar3;
            local_138.fpclass = cpp_dec_float_finite;
            local_138.prec_elem = 0x1c;
            local_138.data._M_elems[0] = 0;
            local_138.data._M_elems[1] = 0;
            local_138.data._M_elems[2] = 0;
            local_138.data._M_elems[3] = 0;
            local_138.data._M_elems[4] = 0;
            local_138.data._M_elems[5] = 0;
            local_138.data._M_elems[6] = 0;
            local_138.data._M_elems[7] = 0;
            local_138.data._M_elems[8] = 0;
            local_138.data._M_elems[9] = 0;
            local_138.data._M_elems[10] = 0;
            local_138.data._M_elems[0xb] = 0;
            local_138.data._M_elems[0xc] = 0;
            local_138.data._M_elems[0xd] = 0;
            local_138.data._M_elems[0xe] = 0;
            local_138.data._M_elems[0xf] = 0;
            local_138.data._M_elems[0x10] = 0;
            local_138.data._M_elems[0x11] = 0;
            local_138.data._M_elems[0x12] = 0;
            local_138.data._M_elems[0x13] = 0;
            local_138.data._M_elems[0x14] = 0;
            local_138.data._M_elems[0x15] = 0;
            local_138.data._M_elems[0x16] = 0;
            local_138.data._M_elems[0x17] = 0;
            local_138.data._M_elems[0x18] = 0;
            local_138.data._M_elems[0x19] = 0;
            local_138.data._M_elems._104_5_ = 0;
            local_138.data._M_elems[0x1b]._1_3_ = 0;
            local_138.exp = 0;
            local_138.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&local_138,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)(this->u).row.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar21),&local_1b8);
            pnVar8 = (this->l).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar16 = &local_138;
            pnVar17 = pnVar8 + iVar10;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
              pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
            }
            pnVar8[iVar10].m_backend.exp = local_138.exp;
            pnVar8[iVar10].m_backend.neg = local_138.neg;
            pnVar8[iVar10].m_backend.fpclass = local_138.fpclass;
            pnVar8[iVar10].m_backend.prec_elem = local_138.prec_elem;
            iVar10 = iVar10 + 1;
            piVar7 = (this->u).row.idx;
            *(int *)((long)piVar7 + lVar15) = piVar7[lVar12];
            pnVar8 = (this->u).row.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar17 = pnVar8 + lVar12;
            puVar19 = (undefined4 *)((long)pnVar8[-1].m_backend.data._M_elems + lVar21);
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar19 = (pnVar17->m_backend).data._M_elems[0];
              pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
              puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
            }
            *(int *)((long)(&pnVar8[-1].m_backend.data + 1) + lVar21) = pnVar8[lVar12].m_backend.exp
            ;
            *(bool *)((long)(&pnVar8[-1].m_backend.data + 1) + 4U + lVar21) =
                 pnVar8[lVar12].m_backend.neg;
            *(undefined8 *)((long)(&pnVar8[-1].m_backend.data + 1) + 8U + lVar21) =
                 *(undefined8 *)&pnVar8[lVar12].m_backend.fpclass;
            if (iVar11 == 2) {
              iVar11 = (this->temp).stage;
              (this->temp).stage = iVar11 + 1;
              piVar5[iVar11] = iVar3;
            }
            else if (iVar11 == 1) {
              this->stat = SINGULAR;
              return;
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar4);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < (this->temp).stage);
  }
  return;
}

Assistant:

void CLUFactor<R>::rowSingletons()
{
   R pval;
   int i, j, k, ll, r;
   int p_row, p_col, len, rs, lk;
   int* idx;
   int* rperm = row.perm;
   int* sing = temp.s_mark;

   /*  Mark row singletons
    */
   rs = temp.stage;

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0 && u.row.len[i] == 1)
         sing[temp.stage++] = i;
   }

   /*  Eliminate row singletons
    *  thereby marking newly arising ones
    *  until no more can be found.
    */
   for(; rs < temp.stage; ++rs)
   {
      /*      Move pivot element from row file to diag
       */
      p_row = sing[rs];
      j = u.row.start[p_row];
      p_col = u.row.idx[j];
      pval = u.row.val[j];
      setPivot(rs, p_col, p_row, pval);
      u.row.len[p_row] = 0;

      /*      Remove pivot column form workingmatrix
       *      thereby building up L VectorBase<R>.
       */
      idx = &(u.col.idx[u.col.start[p_col]]);
      i = temp.s_cact[p_col];                /* nr. nonzeros of new L VectorBase<R> */
      lk = makeLvec(i - 1, p_row);
      len = u.col.len[p_col];
      i = (u.col.len[p_col] -= i);         /* remove pivot column from U */

      for(; i < len; ++i)
      {
         r = idx[i];

         if(r != p_row)
         {
            /*      Find pivot column in row.
             */
            ll = --(u.row.len[r]);
            k = u.row.start[r] + ll;

            for(j = k; u.row.idx[j] != p_col; --j)
               ;

            assert(k >= u.row.start[r]);

            /*      Initialize L VectorBase<R>
             */
            l.idx[lk] = r;

            l.val[lk] = u.row.val[j] / pval;

            ++lk;

            /*      Remove pivot column from row.
             */
            u.row.idx[j] = u.row.idx[k];

            u.row.val[j] = u.row.val[k];

            /*      Check new row length.
             */
            if(ll == 1)
               sing[temp.stage++] = r;
            else if(ll == 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }
         }
      }
   }
}